

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar * __thiscall
icu_63::Normalizer2Impl::getRawDecomposition
          (Normalizer2Impl *this,UChar32 c,UChar *buffer,int32_t *length)

{
  int iVar1;
  ushort uVar2;
  undefined2 uVar3;
  uint16_t *puVar4;
  long lVar5;
  uint16_t uVar6;
  int iVar7;
  UChar *pUVar8;
  short sVar9;
  ulong uVar10;
  int iVar11;
  UChar UVar12;
  uint uVar13;
  
  if ((int)(uint)(ushort)this->minDecompNoCP <= c) {
    uVar6 = getNorm16(this,c);
    pUVar8 = (UChar *)0x0;
    if ((this->minYesNo <= uVar6) && (uVar6 < this->minMaybeYes)) {
      pUVar8 = buffer;
      if ((this->minYesNo == uVar6) || (uVar3 = this->minYesNoMappingsOnly, (uVar3 | 1) == uVar6)) {
        iVar1 = c + -0xac00;
        iVar7 = (int)((ulong)((long)iVar1 * -0x6db6db6d) >> 0x20) + c + -0xac00;
        iVar7 = (iVar7 >> 4) - (iVar7 >> 0x1f);
        iVar11 = iVar1 + iVar7 * -0x1c;
        if (iVar11 == 0) {
          UVar12 = ((short)((ulong)((long)iVar1 * 0x6f74ae27) >> 0x28) - (short)(iVar1 >> 0x1f)) +
                   L'ᄀ';
          iVar11 = iVar7 % 0x15;
          sVar9 = 0x1161;
        }
        else {
          UVar12 = (short)c - (short)iVar11;
          sVar9 = 0x11a7;
        }
        *buffer = UVar12;
        buffer[1] = sVar9 + (short)iVar11;
        *length = 2;
      }
      else if (uVar6 < this->limitNoNo) {
        puVar4 = this->extraData;
        uVar10 = (ulong)(uVar6 & 0xfffe);
        uVar2 = *(ushort *)((long)puVar4 + uVar10);
        uVar13 = uVar2 & 0x1f;
        if ((uVar2 & 0x40) == 0) {
          *length = uVar13;
          pUVar8 = (UChar *)((long)puVar4 + uVar10 + 2);
        }
        else {
          lVar5 = uVar10 - (uVar2 >> 6 & 2);
          UVar12 = *(UChar *)((long)puVar4 + lVar5 + -2);
          if ((ushort)UVar12 < 0x20) {
            *length = (uint)(ushort)UVar12;
            pUVar8 = (UChar *)((long)puVar4 + ((lVar5 + -2) - (ulong)((uint)(ushort)UVar12 * 2)));
          }
          else {
            *buffer = UVar12;
            u_memcpy_63(buffer + 1,(UChar *)((long)puVar4 + uVar10 + 6),uVar13 - 2);
            *length = uVar13 - 1;
          }
        }
      }
      else {
        uVar13 = ((uint)(uVar6 >> 3) + c) - (uint)this->centerNoNoDelta;
        if (uVar13 < 0x10000) {
          *length = 1;
          *buffer = (UChar)uVar13;
        }
        else {
          *buffer = (short)(uVar13 >> 10) + L'ퟀ';
          *length = 2;
          buffer[1] = (UChar)uVar13 & 0x3ffU | 0xdc00;
        }
      }
    }
    return pUVar8;
  }
  return (UChar *)0x0;
}

Assistant:

const UChar *
Normalizer2Impl::getRawDecomposition(UChar32 c, UChar buffer[30], int32_t &length) const {
    uint16_t norm16;
    if(c<minDecompNoCP || isDecompYes(norm16=getNorm16(c))) {
        // c does not decompose
        return NULL;
    } else if(isHangulLV(norm16) || isHangulLVT(norm16)) {
        // Hangul syllable: decompose algorithmically
        Hangul::getRawDecomposition(c, buffer);
        length=2;
        return buffer;
    } else if(isDecompNoAlgorithmic(norm16)) {
        c=mapAlgorithmic(c, norm16);
        length=0;
        U16_APPEND_UNSAFE(buffer, length, c);
        return buffer;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    int32_t mLength=firstUnit&MAPPING_LENGTH_MASK;  // length of normal mapping
    if(firstUnit&MAPPING_HAS_RAW_MAPPING) {
        // Read the raw mapping from before the firstUnit and before the optional ccc/lccc word.
        // Bit 7=MAPPING_HAS_CCC_LCCC_WORD
        const uint16_t *rawMapping=mapping-((firstUnit>>7)&1)-1;
        uint16_t rm0=*rawMapping;
        if(rm0<=MAPPING_LENGTH_MASK) {
            length=rm0;
            return (const UChar *)rawMapping-rm0;
        } else {
            // Copy the normal mapping and replace its first two code units with rm0.
            buffer[0]=(UChar)rm0;
            u_memcpy(buffer+1, (const UChar *)mapping+1+2, mLength-2);
            length=mLength-1;
            return buffer;
        }
    } else {
        length=mLength;
        return (const UChar *)mapping+1;
    }
}